

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_client_write(Curl_easy *data,int type,char *buf,size_t blen)

{
  size_t sStack_30;
  CURLcode result;
  size_t blen_local;
  char *buf_local;
  int type_local;
  Curl_easy *data_local;
  
  sStack_30 = blen;
  if ((((type & 1U) != 0) && ((data->conn->handler->protocol & 0xc) != 0)) &&
     ((data->conn->proto).ftpc.transfertype == 'A')) {
    sStack_30 = convert_lineends(data,buf,blen);
  }
  if (((data->req).writer_stack != (Curl_cwriter *)0x0) ||
     (data_local._4_4_ = do_init_stack(data), data_local._4_4_ == CURLE_OK)) {
    data_local._4_4_ = Curl_cwriter_write(data,(data->req).writer_stack,type,buf,sStack_30);
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_client_write(struct Curl_easy *data,
                           int type, char *buf, size_t blen)
{
  CURLcode result;

#if !defined(CURL_DISABLE_FTP) && defined(CURL_DO_LINEEND_CONV)
  /* FTP data may need conversion. */
  if((type & CLIENTWRITE_BODY) &&
     (data->conn->handler->protocol & PROTO_FAMILY_FTP) &&
     data->conn->proto.ftpc.transfertype == 'A') {
    /* convert end-of-line markers */
    blen = convert_lineends(data, buf, blen);
  }
#endif
  /* it is one of those, at least */
  DEBUGASSERT(type & (CLIENTWRITE_BODY|CLIENTWRITE_HEADER|CLIENTWRITE_INFO));
  /* BODY is only BODY (with optional EOS) */
  DEBUGASSERT(!(type & CLIENTWRITE_BODY) ||
              ((type & ~(CLIENTWRITE_BODY|CLIENTWRITE_EOS)) == 0));
  /* INFO is only INFO (with optional EOS) */
  DEBUGASSERT(!(type & CLIENTWRITE_INFO) ||
              ((type & ~(CLIENTWRITE_INFO|CLIENTWRITE_EOS)) == 0));

  if(!data->req.writer_stack) {
    result = do_init_stack(data);
    if(result)
      return result;
    DEBUGASSERT(data->req.writer_stack);
  }

  return Curl_cwriter_write(data, data->req.writer_stack, type, buf, blen);
}